

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

int ncnn::convolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar10;
  float fVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000018;
  long *in_stack_00000020;
  float w_1;
  float val_1;
  int k_1;
  float *sptr_1;
  int q;
  float *kptr_1;
  float sum_1;
  int j_1;
  float *weight_data_ptr;
  float *outptr_1;
  int p;
  int g_1;
  int outh_g;
  int h_g;
  float w;
  float val;
  int k;
  float *sptr;
  float sum;
  int j;
  float *kptr;
  float *outptr;
  int g;
  int bias_term;
  int outh;
  int outw;
  int h;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float local_274;
  float local_264;
  int local_244;
  float *local_240;
  int local_234;
  long local_230;
  float local_228;
  int local_224;
  int local_20c;
  int local_208;
  int local_1f4;
  float *local_1f0;
  float local_1e8;
  int local_1e4;
  int local_1cc;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  long *local_e8;
  float local_dc [3];
  long *local_d0;
  undefined8 local_c8;
  long *local_c0;
  undefined8 local_b8;
  long *local_b0;
  undefined8 local_a8;
  long *local_a0;
  undefined8 local_98;
  long *local_90;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  long *local_60;
  float local_54 [3];
  long *local_48;
  undefined8 local_40;
  long *local_38;
  undefined8 local_30;
  long *local_28;
  undefined8 local_20;
  long *local_18;
  undefined8 local_10;
  long *local_8;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  bVar10 = true;
  if (*in_RCX != 0) {
    bVar10 = in_RCX[8] * (long)(int)in_RCX[7] == 0;
  }
  if (((int)in_RDI[6] == in_stack_00000010) && (in_stack_00000010 == (int)in_RSI[6])) {
    for (local_1cc = 0; local_1cc < in_stack_00000010; local_1cc = local_1cc + 1) {
      lVar4 = *in_RSI;
      iVar7 = *(int *)((long)in_RSI + 0x2c);
      lVar5 = in_RSI[2];
      lVar6 = *in_RDX;
      for (local_1e4 = 0; local_1e4 < iVar2; local_1e4 = local_1e4 + 1) {
        local_1e8 = 0.0;
        if (!bVar10) {
          local_1e8 = *(float *)(*in_RCX + (long)local_1cc * 4);
        }
        local_1f0 = (float *)(*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)local_1cc *
                                        in_RDI[2] + (long)(local_1e4 * in_R9D) * 4);
        for (local_1f4 = 0; local_1f4 < in_R8D; local_1f4 = local_1f4 + 1) {
          local_1e8 = *local_1f0 *
                      *(float *)(lVar6 + (long)(in_R8D * local_1cc) * 4 + (long)local_1f4 * 4) +
                      local_1e8;
          local_1f0 = local_1f0 + in_stack_00000008;
        }
        local_54[0] = local_1e8;
        local_60 = in_stack_00000020;
        switch(in_stack_00000018) {
        case 1:
          dVar12 = std::fmax((double)(ulong)(uint)local_1e8,0.0);
          local_54[0] = SUB84(dVar12,0);
          break;
        case 2:
          local_8 = in_stack_00000020;
          local_10 = 0;
          local_64 = *(float *)*in_stack_00000020;
          if (local_1e8 <= 0.0) {
            local_264 = local_1e8 * local_64;
          }
          else {
            local_264 = local_1e8;
          }
          local_54[0] = local_264;
          break;
        case 3:
          local_18 = in_stack_00000020;
          local_20 = 0;
          local_68 = *(float *)*in_stack_00000020;
          local_28 = in_stack_00000020;
          local_30 = 1;
          local_6c = *(float *)(*in_stack_00000020 + 4);
          if (local_1e8 < local_68) {
            local_54[0] = local_68;
          }
          if (local_6c < local_54[0]) {
            local_54[0] = local_6c;
          }
          break;
        case 4:
          local_70 = 88.37626;
          pfVar9 = std::min<float>(local_54,&local_70);
          local_54[0] = *pfVar9;
          local_74 = -88.37626;
          pfVar9 = std::max<float>(local_54,&local_74);
          local_54[0] = *pfVar9;
          dVar12 = std::exp((double)(ulong)(uint)-local_54[0]);
          local_54[0] = 1.0 / (SUB84(dVar12,0) + 1.0);
          break;
        case 5:
          auVar13._0_8_ = std::exp((double)(ulong)(uint)local_1e8);
          auVar13._8_8_ = extraout_XMM0_Qb;
          auVar14._4_12_ = auVar13._4_12_;
          auVar14._0_4_ = SUB84(auVar13._0_8_,0) + 1.0;
          dVar12 = std::log(auVar14._0_8_);
          dVar12 = std::tanh(dVar12);
          local_54[0] = local_1e8 * SUB84(dVar12,0);
          break;
        case 6:
          local_38 = in_stack_00000020;
          local_40 = 0;
          local_78 = *(float *)*in_stack_00000020;
          local_48 = in_stack_00000020;
          local_54[1] = 1.4013e-45;
          local_54[2] = 0.0;
          local_7c = *(float *)(*in_stack_00000020 + 4);
          local_80 = -local_7c / local_78;
          local_84 = 1.0 / local_78 + local_80;
          if (local_80 <= local_1e8) {
            if (local_1e8 <= local_84) {
              local_54[0] = local_1e8 * (local_1e8 * local_78 + local_7c);
            }
          }
          else {
            local_54[0] = 0.0;
          }
        }
        *(float *)(lVar4 + (long)iVar7 * (long)local_1cc * lVar5 + (long)local_1e4 * 4) =
             local_54[0];
      }
    }
  }
  else {
    iVar7 = (int)in_RDI[6] / in_stack_00000010;
    iVar8 = (int)in_RSI[6] / in_stack_00000010;
    for (local_208 = 0; local_208 < in_stack_00000010; local_208 = local_208 + 1) {
      for (local_20c = 0; local_20c < iVar8; local_20c = local_20c + 1) {
        lVar4 = *in_RSI;
        iVar3 = *(int *)((long)in_RSI + 0x2c);
        lVar5 = in_RSI[2];
        lVar6 = *in_RDX;
        for (local_224 = 0; local_224 < iVar2; local_224 = local_224 + 1) {
          local_228 = 0.0;
          if (!bVar10) {
            local_228 = *(float *)(*in_RCX + (long)(iVar8 * local_208 + local_20c) * 4);
          }
          local_230 = lVar6 + (long)(in_R8D * iVar7 * iVar8 * local_208) * 4 +
                      (long)(in_R8D * iVar7 * local_20c) * 4;
          for (local_234 = 0; local_234 < iVar7; local_234 = local_234 + 1) {
            local_240 = (float *)(*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) *
                                            (long)(iVar7 * local_208 + local_234) * in_RDI[2] +
                                 (long)(local_224 * in_R9D) * 4);
            for (local_244 = 0; local_244 < in_R8D; local_244 = local_244 + 1) {
              local_228 = *local_240 * *(float *)(local_230 + (long)local_244 * 4) + local_228;
              local_240 = local_240 + in_stack_00000008;
            }
            local_230 = local_230 + (long)in_R8D * 4;
          }
          local_dc[0] = local_228;
          local_e8 = in_stack_00000020;
          switch(in_stack_00000018) {
          case 1:
            dVar12 = std::fmax((double)(ulong)(uint)local_228,0.0);
            local_dc[0] = SUB84(dVar12,0);
            break;
          case 2:
            local_90 = in_stack_00000020;
            local_98 = 0;
            local_ec = *(float *)*in_stack_00000020;
            if (local_228 <= 0.0) {
              local_274 = local_228 * local_ec;
            }
            else {
              local_274 = local_228;
            }
            local_dc[0] = local_274;
            break;
          case 3:
            local_a0 = in_stack_00000020;
            local_a8 = 0;
            local_f0 = *(float *)*in_stack_00000020;
            local_b0 = in_stack_00000020;
            local_b8 = 1;
            local_f4 = *(float *)(*in_stack_00000020 + 4);
            if (local_228 < local_f0) {
              local_dc[0] = local_f0;
            }
            if (local_f4 < local_dc[0]) {
              local_dc[0] = local_f4;
            }
            break;
          case 4:
            local_f8 = 88.37626;
            pfVar9 = std::min<float>(local_dc,&local_f8);
            local_dc[0] = *pfVar9;
            local_fc = -88.37626;
            pfVar9 = std::max<float>(local_dc,&local_fc);
            local_dc[0] = *pfVar9;
            dVar12 = std::exp((double)(ulong)(uint)-local_dc[0]);
            local_dc[0] = 1.0 / (SUB84(dVar12,0) + 1.0);
            break;
          case 5:
            auVar15._0_8_ = std::exp((double)(ulong)(uint)local_228);
            auVar15._8_8_ = extraout_XMM0_Qb_00;
            auVar16._4_12_ = auVar15._4_12_;
            auVar16._0_4_ = SUB84(auVar15._0_8_,0) + 1.0;
            dVar12 = std::log(auVar16._0_8_);
            dVar12 = std::tanh(dVar12);
            local_dc[0] = local_228 * SUB84(dVar12,0);
            break;
          case 6:
            local_c0 = in_stack_00000020;
            local_c8 = 0;
            fVar1 = *(float *)*in_stack_00000020;
            local_d0 = in_stack_00000020;
            local_dc[1] = 1.4013e-45;
            local_dc[2] = 0.0;
            fVar11 = -*(float *)(*in_stack_00000020 + 4) / fVar1;
            if (fVar11 <= local_228) {
              if (local_228 <= 1.0 / fVar1 + fVar11) {
                local_dc[0] = local_228 * (local_228 * fVar1 + *(float *)(*in_stack_00000020 + 4));
              }
            }
            else {
              local_dc[0] = 0.0;
            }
          }
          *(float *)(lVar4 + (long)iVar3 * (long)(local_208 * iVar8 + local_20c) * lVar5 +
                    (long)local_224 * 4) = local_dc[0];
        }
      }
    }
  }
  return 0;
}

Assistant:

static int convolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[g];

                const float* sptr = bottom_blob.row(g) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float w = kptr[k];
                    sum += val * w;

                    sptr += dilation_w;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    else
    {
        // group convolution
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                float* outptr = top_blob.row(g * outh_g + p);
                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[outh_g * g + p];

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float* sptr = bottom_blob.row(h_g * g + q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = *sptr;
                            float w = kptr[k];
                            sum += val * w;

                            sptr += dilation_w;
                        }

                        kptr += kernel_w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }
            }
        }
    }

    return 0;
}